

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nosimd.h
# Opt level: O2

void nosimd::arithmetic::mulC<unsigned_short>
               (unsigned_short *pSrc,unsigned_short val,unsigned_short *pDst,int len)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  if (0 < len) {
    uVar1 = (ulong)(uint)len;
  }
  uVar2 = 0;
  if (pSrc == pDst) {
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      pDst[uVar2] = pDst[uVar2] * val;
    }
  }
  else {
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      pDst[uVar2] = pSrc[uVar2] * val;
    }
  }
  return;
}

Assistant:

inline void mulC(const _T * pSrc, _T val, _T * pDst, int len)
        {
            if (pSrc == pDst)
            {
                for (int i = 0; i < len; ++i)
                    pDst[i] *= val;
            }
            else
            {
                for (int i = 0; i < len; ++i)
                    pDst[i] = pSrc[i] * val;
            }
        }